

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRef.c
# Opt level: O3

Rnm_Man_t * Rnm_ManStart(Gia_Man_t *pGia)

{
  int iVar1;
  int iVar2;
  Rnm_Man_t *pRVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  Vec_Str_t *pVVar6;
  char *__s;
  Rnm_Obj_t *pRVar7;
  
  if (pGia->vCos->nSize - pGia->nRegs == 1) {
    pRVar3 = (Rnm_Man_t *)calloc(1,0x80);
    pRVar3->pGia = pGia;
    pVVar4 = (Vec_Int_t *)malloc(0x10);
    pVVar4->nCap = 100;
    pVVar4->nSize = 0;
    piVar5 = (int *)malloc(400);
    pVVar4->pArray = piVar5;
    pRVar3->vObjs = pVVar4;
    iVar1 = pGia->nObjs;
    pVVar6 = (Vec_Str_t *)malloc(0x10);
    iVar2 = 0x10;
    if (0xe < iVar1 - 1U) {
      iVar2 = iVar1;
    }
    pVVar6->nCap = iVar2;
    if (iVar2 == 0) {
      __s = (char *)0x0;
    }
    else {
      __s = (char *)malloc((long)iVar2);
    }
    pVVar6->pArray = __s;
    pVVar6->nSize = iVar1;
    memset(__s,0,(long)iVar1);
    pRVar3->vCounts = pVVar6;
    pVVar4 = (Vec_Int_t *)malloc(0x10);
    pVVar4->nCap = 1000;
    pVVar4->nSize = 0;
    piVar5 = (int *)malloc(4000);
    pVVar4->pArray = piVar5;
    pRVar3->vFanins = pVVar4;
    pRVar3->nObjsAlloc = 10000;
    pRVar7 = (Rnm_Obj_t *)malloc(40000);
    pRVar3->pObjs = pRVar7;
    if (pGia->vFanout == (Vec_Int_t *)0x0) {
      Gia_ManStaticFanoutStart(pGia);
    }
    Gia_ManCleanValue(pGia);
    Gia_ManCleanMark0(pGia);
    Gia_ManCleanMark1(pGia);
    return pRVar3;
  }
  __assert_fail("Gia_ManPoNum(pGia) == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absRef.c"
                ,0x10b,"Rnm_Man_t *Rnm_ManStart(Gia_Man_t *)");
}

Assistant:

Rnm_Man_t * Rnm_ManStart( Gia_Man_t * pGia )
{
    Rnm_Man_t * p;
    assert( Gia_ManPoNum(pGia) == 1 );
    p = ABC_CALLOC( Rnm_Man_t, 1 );
    p->pGia = pGia;
    p->vObjs = Vec_IntAlloc( 100 );
    p->vCounts = Vec_StrStart( Gia_ManObjNum(pGia) );
    p->vFanins = Vec_IntAlloc( 1000 );
//    p->vSatVars = Vec_IntAlloc( 0 );
//    p->vSat2Ids = Vec_IntAlloc( 1000 );
//    p->vIsopMem  = Vec_IntAlloc( 0 );
    p->nObjsAlloc = 10000;
    p->pObjs = ABC_ALLOC( Rnm_Obj_t, p->nObjsAlloc );
    if ( p->pGia->vFanout == NULL )
        Gia_ManStaticFanoutStart( p->pGia );
    Gia_ManCleanValue(pGia);
    Gia_ManCleanMark0(pGia);
    Gia_ManCleanMark1(pGia);
    return p;
}